

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O1

ostream * glu::detail::operator<<(ostream *str,EnumPointerFmt *fmt)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  Enum<int,_4UL> local_38;
  
  if (fmt->value == (deUint32 *)0x0) {
    pcVar2 = "(null)";
    lVar1 = 6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
    if (fmt->size != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        }
        local_38.m_getName = fmt->getName;
        local_38.m_value = fmt->value[uVar3];
        tcu::Format::Enum<int,_4UL>::toStream(&local_38,str);
        uVar3 = uVar3 + 1;
      } while (uVar3 < fmt->size);
    }
    pcVar2 = " }";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar2,lVar1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const EnumPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			// use storage size (4) as print width for clarity
			str << tcu::Format::Enum<int, 4>(fmt.getName, fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}